

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list,double *def_val)

{
  char *pcVar1;
  bool bVar2;
  const_iterator ppcVar3;
  pointer ppVar4;
  string local_250 [32];
  long local_230;
  ostringstream ostr;
  _Self local_b8 [3];
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [32];
  _Self local_58;
  const_iterator optIt;
  char **name;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_char_*const> *__range2;
  double *def_val_local;
  parser *this_local;
  initializer_list<const_char_*const> init_list_local;
  
  init_list_local._M_array = (iterator)init_list._M_len;
  this_local = (parser *)init_list._M_array;
  init_list_local._M_len = (size_type)__return_storage_ptr__;
  __end2 = std::initializer_list<const_char_*const>::begin
                     ((initializer_list<const_char_*const> *)&this_local);
  ppcVar3 = std::initializer_list<const_char_*const>::end
                      ((initializer_list<const_char_*const> *)&this_local);
  while( true ) {
    if (__end2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
      std::ios_base::precision((ios_base *)((long)&local_230 + *(long *)(local_230 + -0x18)),0x15);
      std::ostream::operator<<((ostringstream *)&local_230,*def_val);
      std::__cxx11::ostringstream::str();
      stringstream_proxy::stringstream_proxy(__return_storage_ptr__,local_250);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
      return __return_storage_ptr__;
    }
    optIt._M_node = (_Base_ptr)__end2;
    pcVar1 = *__end2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    trim_leading_dashes((parser *)local_78,(string *)this);
    local_58._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->params_,(key_type *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_b8[0]._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->params_);
    bVar2 = std::operator!=(local_b8,&local_58);
    if (bVar2) break;
    __end2 = __end2 + 1;
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_58);
  stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&ppVar4->second);
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(std::initializer_list<char const* const> init_list, T&& def_val) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }